

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O2

duckdb_state duckdb_query_arrow_array(duckdb_arrow result,duckdb_arrow_array *out_array)

{
  duckdb_arrow result_00;
  ArrowArray *out_array_00;
  bool bVar1;
  pointer pMVar2;
  pointer this;
  ErrorData *error;
  pointer pDVar3;
  ClientContext *context;
  type input;
  duckdb_state dVar4;
  ClientProperties local_90;
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  extension_type_cast;
  
  dVar4 = DuckDBSuccess;
  if (out_array != (duckdb_arrow_array *)0x0) {
    pMVar2 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)result);
    result_00 = result + 8;
    this = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)result);
    error = duckdb::BaseQueryResult::GetErrorObject((BaseQueryResult *)this);
    bVar1 = duckdb::QueryResult::TryFetch
                      (&pMVar2->super_QueryResult,
                       (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                        *)result_00,error);
    if (bVar1) {
      if ((_Head_base<0UL,_duckdb::DataChunk_*,_false>)
          *(_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_> *)
           result_00 != (DataChunk *)0x0) {
        pDVar3 = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                 ::operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                               *)result_00);
        dVar4 = DuckDBSuccess;
        if (pDVar3->count != 0) {
          pMVar2 = duckdb::
                   unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                 *)result);
          context = duckdb::optional_ptr<duckdb::ClientContext,_true>::operator*
                              (&(pMVar2->super_QueryResult).client_properties.client_context);
          pMVar2 = duckdb::
                   unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                 *)result);
          duckdb::ArrowTypeExtensionData::GetExtensionTypes
                    (&extension_type_cast,context,
                     &(pMVar2->super_QueryResult).super_BaseQueryResult.types);
          input = duckdb::
                  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)result_00);
          out_array_00 = (ArrowArray *)*out_array;
          pMVar2 = duckdb::
                   unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                 *)result);
          duckdb::ClientProperties::ClientProperties
                    (&local_90,&(pMVar2->super_QueryResult).client_properties);
          duckdb::ArrowConverter::ToArrowArray(input,out_array_00,&local_90,&extension_type_cast);
          std::__cxx11::string::~string((string *)&local_90);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&extension_type_cast._M_h);
        }
      }
    }
    else {
      dVar4 = DuckDBError;
    }
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_query_arrow_array(duckdb_arrow result, duckdb_arrow_array *out_array) {
	if (!out_array) {
		return DuckDBSuccess;
	}
	auto wrapper = reinterpret_cast<ArrowResultWrapper *>(result);
	auto success = wrapper->result->TryFetch(wrapper->current_chunk, wrapper->result->GetErrorObject());
	if (!success) { // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP
	if (!wrapper->current_chunk || wrapper->current_chunk->size() == 0) {
		return DuckDBSuccess;
	}
	auto extension_type_cast = duckdb::ArrowTypeExtensionData::GetExtensionTypes(
	    *wrapper->result->client_properties.client_context, wrapper->result->types);
	ArrowConverter::ToArrowArray(*wrapper->current_chunk, reinterpret_cast<ArrowArray *>(*out_array),
	                             wrapper->result->client_properties, extension_type_cast);
	return DuckDBSuccess;
}